

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# import_debug_line_header.cpp
# Opt level: O3

error_code __thiscall
pstore::exchange::import_ns::debug_line_index::key(debug_line_index *this,string *s)

{
  undefined1 auVar1 [16];
  undefined8 uVar2;
  uint128 *puVar3;
  ulong uVar4;
  ulong extraout_RDX;
  error_code eVar5;
  maybe<pstore::uint128,_void> digest;
  maybe<pstore::uint128,_void> local_38;
  
  uint128::from_hex_string(&local_38,s);
  uVar4 = extraout_RDX;
  if (local_38.valid_ == true) {
    puVar3 = maybe<pstore::uint128,_void>::operator->(&local_38);
    uVar2 = *(undefined8 *)((long)&puVar3->v_ + 8);
    *(long *)&(this->digest_).v_ = (long)puVar3->v_;
    *(undefined8 *)((long)&(this->digest_).v_ + 8) = uVar2;
    uVar4 = std::_V2::system_category();
  }
  auVar1._8_8_ = 0;
  auVar1._0_8_ = uVar4;
  eVar5 = (error_code)(auVar1 << 0x40);
  if (local_38.valid_ == false) {
    eVar5 = make_error_code(bad_digest);
  }
  return eVar5;
}

Assistant:

std::error_code debug_line_index::key (std::string const & s) {
                if (maybe<uint128> const digest = uint128::from_hex_string (s)) {
                    digest_ = *digest;
                    return {};
                }
                return error::bad_digest;
            }